

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O0

bool __thiscall
dlib::
binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::move_next(binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this)

{
  node *pnVar1;
  bool bVar2;
  node *parent_1;
  node *parent;
  bool from_left;
  bool went_up;
  node *temp;
  binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  bool local_1;
  
  if ((this->at_start_ & 1U) == 0) {
    if (this->current_element == (node *)0x0) {
      local_1 = false;
    }
    else {
      from_left = false;
      if (this->current_element->right == this->NIL) {
        bVar2 = true;
        pnVar1 = this->current_element->parent;
        if (pnVar1 == this->NIL) {
          this->current_element = (node *)0x0;
          return false;
        }
        from_left = pnVar1->left == this->current_element;
        this->current_element = pnVar1;
      }
      else {
        this->current_element = this->current_element->right;
        bVar2 = false;
      }
      do {
        while (!bVar2) {
          if (this->current_element->left == this->NIL) {
            return true;
          }
          this->current_element = this->current_element->left;
          bVar2 = false;
        }
        if (from_left) {
          return true;
        }
        pnVar1 = this->current_element->parent;
        from_left = pnVar1->left == this->current_element;
        this->current_element = pnVar1;
      } while (this->current_element != this->NIL);
      this->current_element = (node *)0x0;
      local_1 = false;
    }
  }
  else {
    this->at_start_ = false;
    if (this->tree_size == 0) {
      local_1 = false;
    }
    else {
      this->current_element = this->tree_root;
      temp = this->current_element->left;
      while (temp != this->NIL) {
        this->current_element = temp;
        temp = this->current_element->left;
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool binary_search_tree_kernel_2<domain,range,mem_manager,compare>::
    move_next (
    ) const
    {
        // if we haven't started iterating yet
        if (at_start_)
        {
            at_start_ = false;
            if (tree_size == 0)
            {
                return false;
            }
            else
            {
                // find the first element in the tree
                current_element = tree_root;
                node* temp = current_element->left;
                while (temp != NIL)
                {
                    current_element = temp;
                    temp = current_element->left;
                }
                return true;
            }
        }
        else
        {
            if (current_element == 0)
            {
                return false;
            }
            else
            {
                bool went_up;  // true if we went up the tree from a child node to parent
                bool from_left = false; // true if we went up and were coming from a left child node
                // find the next element in the tree
                if (current_element->right != NIL)
                {
                    // go right and down                    
                    current_element = current_element->right;
                    went_up = false;
                }
                else
                {
                    went_up = true;
                    node* parent = current_element->parent;
                    if (parent == NIL)
                    {
                        // in this case we have iterated over all the element of the tree
                        current_element = 0;
                        return false;
                    }

                    from_left = (parent->left == current_element);
                    // go up to parent
                    current_element = parent;
                }


                while (true)
                {
                    if (went_up)
                    {
                        if (from_left)
                        {
                            // in this case we have found the next node
                            break;
                        }
                        else
                        {
                            // we should go up
                            node* parent = current_element->parent;
                            from_left = (parent->left == current_element);                            
                            current_element = parent;
                            if (current_element == NIL)
                            {
                                // in this case we have iterated over all the elements
                                // in the tree
                                current_element = 0;
                                return false;
                            }
                        }
                    }
                    else
                    {
                        // we just went down to a child node
                        if (current_element->left != NIL)
                        {
                            // go left
                            went_up = false;
                            current_element = current_element->left;
                        }
                        else
                        {
                            // if there is no left child then we have found the next node
                            break;
                        }
                    }
                }

                return true;               
            }
        }
    }